

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_function_args_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,TextureFunctionArguments *args,
          bool *p_forward)

{
  undefined **ppuVar1;
  char cVar2;
  uint32_t uVar3;
  Dim DVar4;
  undefined1 *puVar5;
  string *psVar6;
  bool bVar7;
  bool bVar8;
  SPIRType *pSVar9;
  char *pcVar10;
  long *plVar11;
  undefined8 *puVar12;
  runtime_error *this_00;
  size_type *psVar13;
  undefined **ppuVar14;
  string *in_R8;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> coord_expr;
  SPIRType expected_type;
  string local_200;
  SPIRType *local_1e0;
  uint32_t local_1d4;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  uint *local_190;
  size_t local_188;
  uint local_178 [8];
  bool *local_158;
  size_t local_150;
  bool local_140 [24];
  TypedID<(spirv_cross::Types)1> *local_128;
  size_t local_120;
  TypedID<(spirv_cross::Types)1> local_110 [8];
  uint *local_f0;
  size_t local_e8;
  uint local_d8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  bool *local_58;
  string local_50;
  
  uVar3 = (args->base).img.id;
  pSVar9 = (args->base).imgtype;
  local_60 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = p_forward;
  if ((args->base).is_fetch == true) {
    convert_separate_image_to_expression_abi_cxx11_((string *)local_1b0,this,uVar3);
  }
  else {
    to_expression_abi_cxx11_((string *)local_1b0,this,uVar3,true);
  }
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  bVar8 = (this->backend).swizzle_is_function;
  local_1e0 = pSVar9;
  local_1d4 = uVar3;
  bVar7 = should_forward(this,args->coord);
  uVar3 = args->coord_components;
  pSVar9 = Compiler::expression_type(&this->super_Compiler,args->coord);
  pcVar15 = "";
  if (uVar3 != pSVar9->vecsize) {
    if (uVar3 == 1) {
      pcVar15 = ".x";
    }
    else {
      if (uVar3 == 3) {
        pcVar10 = ".xyz()";
        pcVar15 = ".xyz";
      }
      else {
        if (uVar3 != 2) goto LAB_001cc226;
        pcVar10 = ".xy()";
        pcVar15 = ".xy";
      }
      if (bVar8 != false) {
        pcVar15 = pcVar10;
      }
    }
  }
LAB_001cc226:
  cVar2 = *pcVar15;
  if (cVar2 == '\0') {
    to_expression_abi_cxx11_(&local_1d0,this,args->coord,true);
  }
  else {
    to_enclosed_expression_abi_cxx11_(&local_50,this,args->coord,true);
    plVar11 = (long *)::std::__cxx11::string::append((char *)&local_50);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_1d0.field_2._M_allocated_capacity = *psVar13;
      local_1d0.field_2._8_8_ = plVar11[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *psVar13;
      local_1d0._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_1d0._M_string_length = plVar11[1];
    *plVar11 = (long)psVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
  }
  if ((cVar2 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pSVar9 = Compiler::expression_type(&this->super_Compiler,args->coord);
  if (*(int *)&(pSVar9->super_IVariant).field_0xc == 8) {
    SPIRType::SPIRType((SPIRType *)local_1b0,pSVar9);
    local_1a0._M_allocated_capacity._4_4_ = args->coord_components;
    local_1b0._12_4_ = 7;
    in_R8 = &local_1d0;
    bitcast_expression(&local_200,this,(SPIRType *)local_1b0,
                       *(BaseType *)&(pSVar9->super_IVariant).field_0xc,in_R8);
    ::std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    local_1b0._0_8_ = &PTR__SPIRType_0035b448;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_98);
    local_e8 = 0;
    if (local_f0 != local_d8) {
      free(local_f0);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    local_150 = 0;
    if (local_158 != local_140) {
      free(local_158);
    }
    local_188 = 0;
    if (local_190 != local_178) {
      free(local_190);
    }
  }
  if (((((local_1e0->image).arrayed == true) && ((local_1e0->image).dim == Dim2D)) ||
      ((local_1e0->image).dim == DimCube)) &&
     (bVar8 = Compiler::image_is_comparison(&this->super_Compiler,local_1e0,local_1d4), bVar8)) {
    bVar8 = args->lod != 0;
  }
  else {
    bVar8 = false;
  }
  if (args->dref == 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
  }
  else {
    if (bVar7) {
      bVar7 = should_forward(this,args->dref);
    }
    else {
      bVar7 = false;
    }
    if (((args->base).is_gather == false) && (args->coord_components != 4)) {
      if ((args->base).is_proj == true) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        DVar4 = (local_1e0->image).dim;
        if (DVar4 == Dim2D) {
          to_enclosed_expression_abi_cxx11_(&local_200,this,args->coord,true);
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_200);
          ppuVar1 = (undefined **)(local_1b0 + 0x10);
          ppuVar14 = (undefined **)(plVar11 + 2);
          if ((undefined **)*plVar11 == ppuVar14) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1a0._8_8_ = plVar11[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1b0._0_8_ = (undefined **)*plVar11;
          }
          local_1b0._8_8_ = plVar11[1];
          *plVar11 = (long)ppuVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_enclosed_expression_abi_cxx11_(&local_200,this,args->coord,true);
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_200);
          ppuVar14 = (undefined **)(plVar11 + 2);
          if ((undefined **)*plVar11 == ppuVar14) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1a0._8_8_ = plVar11[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1b0._0_8_ = (undefined **)*plVar11;
          }
          local_1b0._8_8_ = plVar11[1];
          *plVar11 = (long)ppuVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        }
        else {
          if (DVar4 != Dim1D) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1b0._0_8_ = local_1b0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"Invalid type for textureProj with shadow.","");
            ::std::runtime_error::runtime_error(this_00,(string *)local_1b0);
            *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          to_enclosed_expression_abi_cxx11_(&local_200,this,args->coord,true);
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_200);
          ppuVar1 = (undefined **)(local_1b0 + 0x10);
          ppuVar14 = (undefined **)(plVar11 + 2);
          if ((undefined **)*plVar11 == ppuVar14) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1a0._8_8_ = plVar11[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1b0._0_8_ = (undefined **)*plVar11;
          }
          local_1b0._8_8_ = plVar11[1];
          *plVar11 = (long)ppuVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
          if ((undefined **)local_1b0._0_8_ != ppuVar1) {
            operator_delete((void *)local_1b0._0_8_);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          to_enclosed_expression_abi_cxx11_(&local_200,this,args->coord,true);
          puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_200);
          ppuVar14 = (undefined **)(puVar12 + 2);
          if ((undefined **)*puVar12 == ppuVar14) {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1a0._8_8_ = puVar12[3];
            local_1b0._0_8_ = ppuVar1;
          }
          else {
            local_1a0._M_allocated_capacity = (size_type)*ppuVar14;
            local_1b0._0_8_ = (undefined **)*puVar12;
          }
          local_1b0._8_8_ = puVar12[1];
          *puVar12 = ppuVar14;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        }
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) goto LAB_001cc9fd;
      }
      else {
        pSVar9 = Compiler::expression_type(&this->super_Compiler,args->coord);
        SPIRType::SPIRType((SPIRType *)local_1b0,pSVar9);
        local_1a0._M_allocated_capacity._4_4_ = args->coord_components + 1;
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        type_to_glsl_constructor_abi_cxx11_(&local_200,this,(SPIRType *)local_1b0);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1d0._M_dataplus._M_p);
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        to_expression_abi_cxx11_(&local_200,this,args->dref,true);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p);
        }
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_1b0._0_8_ = &PTR__SPIRType_0035b448;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&local_98);
        local_e8 = 0;
        if (local_f0 != local_d8) {
          free(local_f0);
        }
        local_120 = 0;
        if (local_128 != local_110) {
          free(local_128);
        }
        local_150 = 0;
        if (local_158 != local_140) {
          free(local_158);
        }
        local_188 = 0;
        if (local_190 != local_178) {
          free(local_190);
        }
      }
    }
    else {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_1b0,this,args->coord,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
        operator_delete((void *)local_1b0._0_8_);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      to_expression_abi_cxx11_((string *)local_1b0,this,args->dref,true);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
      local_200._M_dataplus._M_p = (pointer)local_1b0._0_8_;
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
LAB_001cc9fd:
        operator_delete(local_200._M_dataplus._M_p);
      }
    }
  }
  if (args->grad_y != 0 || args->grad_x != 0) {
    if ((bVar7 == false) || (bVar7 = should_forward(this,args->grad_x), !bVar7)) {
      bVar7 = false;
    }
    else {
      bVar7 = should_forward(this,args->grad_y);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->grad_x,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->grad_y,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->lod == 0) {
    if ((((args->base).is_fetch == true) && ((local_1e0->image).dim != DimBuffer)) &&
       ((local_1e0->image).ms == false)) {
LAB_001ccb5b:
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else if (bVar8) {
    DVar4 = (local_1e0->image).dim;
    if ((DVar4 == Dim2D) || (DVar4 == DimCube)) goto LAB_001ccb5b;
  }
  else {
    bVar8 = check_explicit_lod_allowed(this,args->lod);
    if (bVar8) {
      if (bVar7 == false) {
        bVar7 = false;
      }
      else {
        bVar7 = should_forward(this,args->lod);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pSVar9 = Compiler::expression_type(&this->super_Compiler,args->lod);
      if ((((args->base).is_fetch == true) && ((local_1e0->image).dim != DimBuffer)) &&
         (((local_1e0->image).ms == false && (*(int *)&(pSVar9->super_IVariant).field_0xc != 7)))) {
        to_expression_abi_cxx11_(&local_200,this,args->lod,true);
        join<char_const(&)[5],std::__cxx11::string,char_const(&)[2]>
                  ((string *)local_1b0,(spirv_cross *)0x2e42a4,(char (*) [5])&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e3e76,
                   (char (*) [2])in_R8);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_);
        }
        psVar6 = &local_200;
      }
      else {
        to_expression_abi_cxx11_((string *)local_1b0,this,args->lod,true);
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
        psVar6 = (string *)local_1b0;
      }
      puVar5 = (undefined1 *)(&(psVar6->field_2)._M_allocated_capacity)[-2];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar5 != &psVar6->field_2) {
        operator_delete(puVar5);
      }
    }
  }
  if (args->coffset == 0) {
    if (args->offset == 0) goto LAB_001ccc9a;
    if (bVar7 == false) {
      bVar7 = false;
    }
    else {
      bVar7 = should_forward(this,args->offset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->offset,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
  }
  else {
    if (bVar7 == false) {
      bVar7 = false;
    }
    else {
      bVar7 = should_forward(this,args->coffset);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->coffset,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
  }
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
LAB_001ccc9a:
  if (args->sample != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->sample,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->min_lod != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->min_lod,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->sparse_texel != 0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->sparse_texel,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->bias != 0) {
    if (bVar7 == false) {
      bVar7 = false;
    }
    else {
      bVar7 = should_forward(this,args->bias);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->bias,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  if (args->component != 0) {
    if (bVar7 == false) {
      bVar7 = false;
    }
    else {
      bVar7 = should_forward(this,args->component);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    to_expression_abi_cxx11_((string *)local_1b0,this,args->component,true);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1b0._0_8_);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_);
    }
  }
  *local_58 = bVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_function_args(const TextureFunctionArguments &args, bool *p_forward)
{
	VariableID img = args.base.img;
	auto &imgtype = *args.base.imgtype;

	string farg_str;
	if (args.base.is_fetch)
		farg_str = convert_separate_image_to_expression(img);
	else
		farg_str = to_expression(img);

	bool swizz_func = backend.swizzle_is_function;
	auto swizzle = [swizz_func](uint32_t comps, uint32_t in_comps) -> const char * {
		if (comps == in_comps)
			return "";

		switch (comps)
		{
		case 1:
			return ".x";
		case 2:
			return swizz_func ? ".xy()" : ".xy";
		case 3:
			return swizz_func ? ".xyz()" : ".xyz";
		default:
			return "";
		}
	};

	bool forward = should_forward(args.coord);

	// The IR can give us more components than we need, so chop them off as needed.
	auto swizzle_expr = swizzle(args.coord_components, expression_type(args.coord).vecsize);
	// Only enclose the UV expression if needed.
	auto coord_expr =
	    (*swizzle_expr == '\0') ? to_expression(args.coord) : (to_enclosed_expression(args.coord) + swizzle_expr);

	// texelFetch only takes int, not uint.
	auto &coord_type = expression_type(args.coord);
	if (coord_type.basetype == SPIRType::UInt)
	{
		auto expected_type = coord_type;
		expected_type.vecsize = args.coord_components;
		expected_type.basetype = SPIRType::Int;
		coord_expr = bitcast_expression(expected_type, coord_type.basetype, coord_expr);
	}

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad =
	    ((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    image_is_comparison(imgtype, img) && args.lod != 0;

	if (args.dref)
	{
		forward = forward && should_forward(args.dref);

		// SPIR-V splits dref and coordinate.
		if (args.base.is_gather ||
		    args.coord_components == 4) // GLSL also splits the arguments in two. Same for textureGather.
		{
			farg_str += ", ";
			farg_str += to_expression(args.coord);
			farg_str += ", ";
			farg_str += to_expression(args.dref);
		}
		else if (args.base.is_proj)
		{
			// Have to reshuffle so we get vec4(coord, dref, proj), special case.
			// Other shading languages splits up the arguments for coord and compare value like SPIR-V.
			// The coordinate type for textureProj shadow is always vec4 even for sampler1DShadow.
			farg_str += ", vec4(";

			if (imgtype.image.dim == Dim1D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + ".x";
				farg_str += ", ";
				farg_str += "0.0, ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".y)";
			}
			else if (imgtype.image.dim == Dim2D)
			{
				// Could reuse coord_expr, but we will mess up the temporary usage checking.
				farg_str += to_enclosed_expression(args.coord) + (swizz_func ? ".xy()" : ".xy");
				farg_str += ", ";
				farg_str += to_expression(args.dref);
				farg_str += ", ";
				farg_str += to_enclosed_expression(args.coord) + ".z)";
			}
			else
				SPIRV_CROSS_THROW("Invalid type for textureProj with shadow.");
		}
		else
		{
			// Create a composite which merges coord/dref into a single vector.
			auto type = expression_type(args.coord);
			type.vecsize = args.coord_components + 1;
			farg_str += ", ";
			farg_str += type_to_glsl_constructor(type);
			farg_str += "(";
			farg_str += coord_expr;
			farg_str += ", ";
			farg_str += to_expression(args.dref);
			farg_str += ")";
		}
	}
	else
	{
		farg_str += ", ";
		farg_str += coord_expr;
	}

	if (args.grad_x || args.grad_y)
	{
		forward = forward && should_forward(args.grad_x);
		forward = forward && should_forward(args.grad_y);
		farg_str += ", ";
		farg_str += to_expression(args.grad_x);
		farg_str += ", ";
		farg_str += to_expression(args.grad_y);
	}

	if (args.lod)
	{
		if (workaround_lod_array_shadow_as_grad)
		{
			// Implement textureGrad() instead. LOD == 0.0 is implemented as gradient of 0.0.
			// Implementing this as plain texture() is not safe on some implementations.
			if (imgtype.image.dim == Dim2D)
				farg_str += ", vec2(0.0), vec2(0.0)";
			else if (imgtype.image.dim == DimCube)
				farg_str += ", vec3(0.0), vec3(0.0)";
		}
		else
		{
			if (check_explicit_lod_allowed(args.lod))
			{
				forward = forward && should_forward(args.lod);
				farg_str += ", ";

				auto &lod_expr_type = expression_type(args.lod);

				// Lod expression for TexelFetch in GLSL must be int, and only int.
				if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms &&
				    lod_expr_type.basetype != SPIRType::Int)
				{
					farg_str += join("int(", to_expression(args.lod), ")");
				}
				else
				{
					farg_str += to_expression(args.lod);
				}
			}
		}
	}
	else if (args.base.is_fetch && imgtype.image.dim != DimBuffer && !imgtype.image.ms)
	{
		// Lod argument is optional in OpImageFetch, but we require a LOD value, pick 0 as the default.
		farg_str += ", 0";
	}

	if (args.coffset)
	{
		forward = forward && should_forward(args.coffset);
		farg_str += ", ";
		farg_str += to_expression(args.coffset);
	}
	else if (args.offset)
	{
		forward = forward && should_forward(args.offset);
		farg_str += ", ";
		farg_str += to_expression(args.offset);
	}

	if (args.sample)
	{
		farg_str += ", ";
		farg_str += to_expression(args.sample);
	}

	if (args.min_lod)
	{
		farg_str += ", ";
		farg_str += to_expression(args.min_lod);
	}

	if (args.sparse_texel)
	{
		// Sparse texel output parameter comes after everything else, except it's before the optional, component/bias arguments.
		farg_str += ", ";
		farg_str += to_expression(args.sparse_texel);
	}

	if (args.bias)
	{
		forward = forward && should_forward(args.bias);
		farg_str += ", ";
		farg_str += to_expression(args.bias);
	}

	if (args.component)
	{
		forward = forward && should_forward(args.component);
		farg_str += ", ";
		farg_str += to_expression(args.component);
	}

	*p_forward = forward;

	return farg_str;
}